

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O2

void __thiscall Assimp::DXF::LineReader::LineReader(LineReader *this,StreamReaderLE *reader)

{
  LineSplitter::LineSplitter(&this->splitter,reader,false,true);
  this->groupcode = 0;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  this->end = 0;
  return;
}

Assistant:

LineReader(StreamReaderLE& reader)
    : splitter(reader,false,true)
    , groupcode( 0 )
    , value()
    , end() {
        // empty
    }